

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsoncbor.cpp
# Opt level: O2

QCborArray __thiscall QCborArray::fromVariantList(QCborArray *this,QVariantList *list)

{
  QVariant *v;
  QVariant *variant;
  long lVar1;
  
  (this->d).d.ptr = (QCborContainerPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QCborArray(this);
  detach(this,(list->d).size);
  variant = (list->d).ptr;
  for (lVar1 = (list->d).size << 5; lVar1 != 0; lVar1 = lVar1 + -0x20) {
    appendVariant((this->d).d.ptr,variant);
    variant = variant + 1;
  }
  return (QExplicitlySharedDataPointer<QCborContainerPrivate>)
         (QExplicitlySharedDataPointer<QCborContainerPrivate>)this;
}

Assistant:

QCborArray QCborArray::fromVariantList(const QVariantList &list)
{
    QCborArray a;
    a.detach(list.size());
    for (const QVariant &v : list)
        appendVariant(a.d.data(), v);
    return a;
}